

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O1

void sysbvm_identitySet_insert(sysbvm_context_t *context,sysbvm_tuple_t set,sysbvm_tuple_t element)

{
  ulong uVar1;
  intptr_t iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int64_t svalue;
  
  if ((element != 0x3f) && ((set & 0xf) == 0 && set != 0)) {
    iVar2 = sysbvm_identitySet_scanFor(set,element);
    if (iVar2 < 0) {
      sysbvm_identitySet_increaseCapacity(context,set);
      iVar2 = sysbvm_identitySet_scanFor(set,element);
      if (iVar2 < 0) {
        sysbvm_error("Set out of memory.");
      }
    }
    lVar3 = *(long *)(*(long *)(set + 0x18) + 0x10 + iVar2 * 8);
    *(sysbvm_tuple_t *)(*(long *)(set + 0x18) + 0x10 + iVar2 * 8) = element;
    if (lVar3 == 0x3f) {
      uVar5 = *(ulong *)(set + 0x18);
      if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
        uVar5 = (ulong)((*(uint *)(uVar5 + 0xc) >> 3) * 3 >> 2);
      }
      else {
        uVar5 = 0;
      }
      uVar1 = *(ulong *)(set + 0x10);
      if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
        lVar3 = (long)uVar1 >> 4;
      }
      else {
        lVar3 = *(long *)(uVar1 + 0x10);
      }
      uVar1 = lVar3 + 1;
      if (lVar3 + 0x800000000000001U >> 0x3c == 0) {
        uVar4 = uVar1 * 0x10 | 0xb;
      }
      else {
        uVar4 = sysbvm_tuple_uint64_encodeBig(context,uVar1);
      }
      *(ulong *)(set + 0x10) = uVar4;
      if (uVar5 <= uVar1) {
        sysbvm_identitySet_increaseCapacity(context,set);
        return;
      }
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_identitySet_insert(sysbvm_context_t *context, sysbvm_tuple_t set, sysbvm_tuple_t element)
{
    if(element == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE)
        return;

    if(!sysbvm_tuple_isNonNullPointer(set))
        return;

    intptr_t elementIndex = sysbvm_identitySet_scanFor(set, element);
    if(elementIndex < 0)
    {
        sysbvm_identitySet_increaseCapacity(context, set);
        elementIndex = sysbvm_identitySet_scanFor(set, element);
        if(elementIndex < 0)
            sysbvm_error("Set out of memory.");
    }

    sysbvm_identitySet_t *setObject = (sysbvm_identitySet_t*)set;
    sysbvm_array_t *storage = (sysbvm_array_t*)setObject->storage;
    bool isNewElement = storage->elements[elementIndex] == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE;
    storage->elements[elementIndex] = element;

    // Count the newly inserted element.
    if(isNewElement)
    {
        size_t capacity = sysbvm_tuple_getSizeInSlots(setObject->storage);
        size_t newSize = sysbvm_tuple_size_decode(setObject->size) + 1;
        setObject->size = sysbvm_tuple_size_encode(context, newSize);
        size_t capacityThreshold = capacity * 3 / 4;

        // Make sure the maximum occupancy rate is not greater than 80%.
        if(newSize >= capacityThreshold)
            sysbvm_identitySet_increaseCapacity(context, set);
    }
}